

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

void satoko_assump_push(solver_t *s,int lit)

{
  vec_uint_t *pvVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)lit >> 1;
  if (s->assigns->size <= uVar4) {
    __assert_fail("lit2var(lit) < (unsigned)satoko_varnum(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver_api.c"
                  ,300,"void satoko_assump_push(solver_t *, int)");
  }
  pvVar1 = s->assumptions;
  uVar3 = pvVar1->cap;
  if (pvVar1->size == uVar3) {
    if (uVar3 < 0x10) {
      puVar2 = (uint *)realloc(pvVar1->data,0x40);
      pvVar1->data = puVar2;
      uVar3 = 0x10;
      if (puVar2 == (uint *)0x0) {
LAB_0054fc45:
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
      }
    }
    else {
      if ((int)uVar3 < 1) goto LAB_0054fbd6;
      puVar2 = (uint *)realloc(pvVar1->data,(ulong)uVar3 * 8);
      pvVar1->data = puVar2;
      if (puVar2 == (uint *)0x0) goto LAB_0054fc45;
      uVar3 = uVar3 * 2;
    }
    pvVar1->cap = uVar3;
  }
LAB_0054fbd6:
  pvVar1->data[pvVar1->size] = lit;
  pvVar1->size = pvVar1->size + 1;
  if (s->polarity->size <= uVar4) {
    __assert_fail("(idx >= 0) && (idx < vec_char_size(p))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_char.h"
                  ,0xb9,"void vec_char_assign(vec_char_t *, unsigned int, char)");
  }
  s->polarity->data[uVar4] = (byte)lit & 1;
  return;
}

Assistant:

void satoko_assump_push(solver_t *s, int lit)
{
    assert(lit2var(lit) < (unsigned)satoko_varnum(s));
    // printf("[Satoko] Push assumption: %d\n", lit);
    vec_uint_push_back(s->assumptions, lit);
    vec_char_assign(s->polarity, lit2var(lit), lit_polarity(lit));
}